

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O0

longlong MercuryJson::parse_number(char *input,bool *is_decimal,size_t offset)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  size_t in_stack_00000090;
  char *in_stack_00000098;
  string *in_stack_000000a0;
  double exponent;
  bool negative_exp;
  double multiplier;
  bool _is_decimal;
  bool negative;
  double decimal;
  longlong integer;
  char *s;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  allocator<char> *in_stack_fffffffffffffe60;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  double local_100;
  double local_d0;
  allocator<char> local_c1 [135];
  byte local_3a;
  byte local_39;
  double local_38;
  _Alloc_hider *local_30;
  char *local_28;
  long local_20;
  byte *local_18;
  long local_10;
  _Alloc_hider *local_8;
  
  local_28 = (char *)(in_RDI + in_RDX);
  local_30 = (_Alloc_hider *)0x0;
  local_38 = 0.0;
  local_3a = 0;
  local_39 = *local_28 == '-';
  if ((bool)local_39) {
    local_28 = local_28 + 1;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*local_28 == '0') {
    local_28 = local_28 + 1;
    if (('/' < *local_28) && (*local_28 < ':')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
      __error(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    }
  }
  else {
    if ((*local_28 < '0') || ('9' < *local_28)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
      __error(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    }
    while (bVar2 = _all_digits(local_28), bVar2) {
      in_stack_fffffffffffffe70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_30 * 100000000);
      uVar3 = _parse_eight_digits((char *)CONCAT17(in_stack_fffffffffffffe47,
                                                   in_stack_fffffffffffffe40));
      local_30 = &in_stack_fffffffffffffe70->_M_dataplus + uVar3;
      local_28 = local_28 + 8;
    }
    while( true ) {
      bVar2 = false;
      if ('/' < *local_28) {
        bVar2 = *local_28 < ':';
      }
      if (!bVar2) break;
      local_30 = (_Alloc_hider *)((long)local_30 * 10 + (long)(*local_28 + -0x30));
      local_28 = local_28 + 1;
    }
    in_stack_fffffffffffffe6f = 0;
  }
  if ((char *)0x12 < local_28 + (-local_20 - local_10)) {
    __a = local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe70,
               (char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),__a);
    __error(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  }
  if (*local_28 == '.') {
    local_3a = 1;
    local_38 = (double)(long)local_30;
    auVar7 = ZEXT1664(ZEXT816(0x3fb999999999999a));
    local_d0 = 0.1;
    local_28 = local_28 + 1;
    while( true ) {
      bVar2 = _all_digits(local_28);
      auVar6 = auVar7._0_16_;
      if (!bVar2) break;
      uVar3 = _parse_eight_digits((char *)CONCAT17(in_stack_fffffffffffffe47,
                                                   in_stack_fffffffffffffe40));
      auVar6 = vcvtusi2sd_avx512f(auVar6,uVar3);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_38;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar6._0_8_ * local_d0;
      auVar6 = vfmadd213sd_fma(ZEXT816(0x3e7ad7f29abcaf48),auVar8,auVar11);
      local_38 = auVar6._0_8_;
      local_d0 = local_d0 * 1e-08;
      auVar7 = ZEXT864((ulong)local_d0);
      local_28 = local_28 + 8;
    }
    while( true ) {
      bVar2 = false;
      if ('/' < *local_28) {
        bVar2 = *local_28 < ':';
      }
      if (!bVar2) break;
      auVar9._0_8_ = (double)(*local_28 + -0x30);
      auVar9._8_8_ = auVar7._8_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_d0;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_38;
      auVar6 = vfmadd213sd_fma(auVar6,auVar9,auVar12);
      local_38 = auVar6._0_8_;
      local_d0 = local_d0 * 0.1;
      auVar7 = ZEXT864((ulong)local_d0);
      local_28 = local_28 + 1;
    }
    if ((local_d0 == 0.1) && (!NAN(local_d0))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
      __error(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    }
  }
  if ((*local_28 == 'e') || (*local_28 == 'E')) {
    if ((local_3a & 1) == 0) {
      local_3a = 1;
      local_38 = (double)(long)local_30;
    }
    pcVar4 = local_28 + 1;
    bVar2 = false;
    if (*pcVar4 == '-') {
      bVar2 = true;
      pcVar4 = local_28 + 2;
    }
    else if (*pcVar4 == '+') {
      pcVar4 = local_28 + 2;
    }
    local_28 = pcVar4;
    auVar7 = ZEXT1664((undefined1  [16])0x0);
    local_100 = 0.0;
    if ((*local_28 < '0') || ('9' < *local_28)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
      __error(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    }
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_100;
      pcVar4 = local_28 + 1;
      auVar13._0_8_ = (double)(*local_28 + -0x30);
      auVar13._8_8_ = auVar7._8_8_;
      auVar6 = vfmadd213sd_fma(ZEXT816(0x4024000000000000),auVar10,auVar13);
      auVar7 = ZEXT1664(auVar6);
      local_100 = auVar6._0_8_;
      bVar1 = false;
      if ('/' < *pcVar4) {
        bVar1 = *pcVar4 < ':';
      }
      local_28 = pcVar4;
    } while (bVar1);
    if (bVar2) {
      local_100 = -local_100;
    }
    if ((local_100 < -308.0) || (308.0 < local_100)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe60);
      __error(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    }
    dVar5 = pow(10.0,local_100);
    local_38 = dVar5 * local_38;
  }
  if (*(long *)(kStructuralOrWhitespace + (long)*local_28 * 8) != 0) {
    *local_18 = local_3a & 1;
    if ((local_39 & 1) == 0) {
      if ((local_3a & 1) == 0) {
        local_8 = local_30;
      }
      else {
        local_8 = (_Alloc_hider *)plain_convert(local_38);
      }
    }
    else if ((local_3a & 1) == 0) {
      local_8 = (_Alloc_hider *)-(long)local_30;
    }
    else {
      local_8 = (_Alloc_hider *)plain_convert(-local_38);
    }
    return (longlong)local_8;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,
             (char *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             in_stack_fffffffffffffe60);
  __error(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
}

Assistant:

long long int parse_number(const char *input, bool *is_decimal, size_t offset) {
#if NO_PARSE_NUMBER
        *is_decimal = false;
        return 0LL;
#endif
        const char *s = input + offset;
        long long int integer = 0LL;
        double decimal = 0.0;
        bool negative = false, _is_decimal = false;
        if (*s == '-') {
            ++s;
            negative = true;
        }
        if (*s == '0') {
            ++s;
            if (*s >= '0' && *s <= '9')
                __error("numbers cannot have leading zeros", input, offset);
        } else {
            if (*s < '0' || *s > '9')
                MercuryJson::__error("numbers must have integer parts", input, offset);
#if PARSE_NUMBER_AVX
            while (_all_digits(s)) {
                integer = integer * 100000000 + _parse_eight_digits(s);
                s += 8;
            }
#endif
            while (*s >= '0' && *s <= '9')
                integer = integer * 10 + (*s++ - '0');
        }
        if (s - input - offset > 18)
            __error("integer part too large", input, offset);
        if (*s == '.') {
            _is_decimal = true;
            decimal = integer;
            double multiplier = 0.1;
            ++s;
#if PARSE_NUMBER_AVX
            while (_all_digits(s)) {
                decimal += _parse_eight_digits(s) * multiplier * 0.0000001;  // 7 digits
                multiplier *= 0.00000001;  // 8 digits
                s += 8;
            }
#endif
            while (*s >= '0' && *s <= '9') {
                decimal += (*s++ - '0') * multiplier;
                multiplier *= 0.1;
            }if (multiplier == 0.1)
                __error("excessive characters at end of number", input, s - input - 1);
        }
        if (*s == 'e' || *s == 'E') {
            if (!_is_decimal) {
                _is_decimal = true;
                decimal = integer;
            }
            ++s;
            bool negative_exp = false;
            if (*s == '-') {
                negative_exp = true;
                ++s;
            } else if (*s == '+') ++s;
            double exponent = 0.0;
            if (*s < '0' || *s > '9')
                MercuryJson::__error("numbers must not have null exponents", input, s - input);
            do {
                exponent = exponent * 10.0 + (*s++ - '0');
            } while (*s >= '0' && *s <= '9');
            if (negative_exp) exponent = -exponent;
            if (exponent < -308 || exponent > 308)
                __error("decimal exponent out of range", input, offset);
            decimal *= pow(10.0, exponent);
        }
        if (!kStructuralOrWhitespace[*s])
            __error("excessive characters at end of number", input, s - input);
        *is_decimal = _is_decimal;
        if (negative) {
            if (_is_decimal) return plain_convert(-decimal);
            else return -integer;
        } else {
            if (_is_decimal) return plain_convert(decimal);
            else return integer;
        }
    }